

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollwrap.c
# Opt level: O0

void pollwrap_add_fd_rwx(pollwrapper *pw,int fd,int rwx)

{
  undefined4 local_1c;
  int events;
  int rwx_local;
  int fd_local;
  pollwrapper *pw_local;
  
  local_1c = 0;
  if ((rwx & 1U) != 0) {
    local_1c = 0xc1;
  }
  if ((rwx & 2U) != 0) {
    local_1c = local_1c | 0x304;
  }
  if ((rwx & 4U) != 0) {
    local_1c = local_1c | 2;
  }
  pollwrap_add_fd_events(pw,fd,local_1c);
  return;
}

Assistant:

void pollwrap_add_fd_rwx(pollwrapper *pw, int fd, int rwx)
{
    int events = 0;
    if (rwx & SELECT_R)
        events |= SELECT_R_IN;
    if (rwx & SELECT_W)
        events |= SELECT_W_IN;
    if (rwx & SELECT_X)
        events |= SELECT_X_IN;
    pollwrap_add_fd_events(pw, fd, events);
}